

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad,realtype droptol,int sparsetype)

{
  double dVar1;
  long *plVar2;
  long M;
  long N;
  void *pvVar3;
  long lVar4;
  long lVar5;
  SUNMatrix_ID SVar6;
  SUNMatrix p_Var7;
  long lVar8;
  sunindextype NNZ;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (droptol < 0.0 || 1 < (uint)sparsetype) {
    return (SUNMatrix)0x0;
  }
  SVar6 = SUNMatGetID(Ad);
  if (SVar6 == SUNMATRIX_DENSE) {
    plVar2 = (long *)Ad->content;
    M = *plVar2;
    N = plVar2[1];
    if (N < 1) {
      NNZ = 0;
    }
    else {
      lVar8 = 0;
      NNZ = 0;
      do {
        if (0 < M) {
          lVar9 = 0;
          do {
            NNZ = NNZ + (ulong)(droptol <
                               ABS(*(double *)(*(long *)(plVar2[4] + lVar8 * 8) + lVar9 * 8)));
            lVar9 = lVar9 + 1;
          } while (M != lVar9);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != N);
    }
    p_Var7 = SUNSparseMatrix(M,N,NNZ,sparsetype);
    if (p_Var7 != (SUNMatrix)0x0) {
      if (sparsetype == 0) {
        lVar8 = N;
        if (N < 1) {
          lVar9 = 0;
        }
        else {
          pvVar3 = p_Var7->content;
          lVar4 = *(long *)((long)pvVar3 + 0x38);
          lVar10 = 0;
          lVar9 = 0;
          do {
            *(long *)(lVar4 + lVar10 * 8) = lVar9;
            if (0 < M) {
              lVar5 = *(long *)(*(long *)((long)Ad->content + 0x20) + lVar10 * 8);
              lVar11 = 0;
              do {
                dVar1 = *(double *)(lVar5 + lVar11 * 8);
                if (droptol < ABS(dVar1)) {
                  *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar9 * 8) = lVar11;
                  *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar9 * 8) = dVar1;
                  lVar9 = lVar9 + 1;
                }
                lVar11 = lVar11 + 1;
              } while (M != lVar11);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != N);
        }
      }
      else {
        lVar8 = M;
        if (M < 1) {
          lVar9 = 0;
        }
        else {
          pvVar3 = p_Var7->content;
          lVar4 = *(long *)((long)pvVar3 + 0x38);
          lVar10 = 0;
          lVar9 = 0;
          do {
            *(long *)(lVar4 + lVar10 * 8) = lVar9;
            if (0 < N) {
              lVar5 = *(long *)((long)Ad->content + 0x20);
              lVar11 = 0;
              do {
                dVar1 = *(double *)(*(long *)(lVar5 + lVar11 * 8) + lVar10 * 8);
                if (droptol < ABS(dVar1)) {
                  *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar9 * 8) = lVar11;
                  *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar9 * 8) = dVar1;
                  lVar9 = lVar9 + 1;
                }
                lVar11 = lVar11 + 1;
              } while (N != lVar11);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != M);
        }
      }
      *(long *)(*(long *)((long)p_Var7->content + 0x38) + lVar8 * 8) = lVar9;
      return p_Var7;
    }
  }
  return (SUNMatrix)0x0;
}

Assistant:

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad, realtype droptol, int sparsetype)
{
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  /* check for legal sparsetype, droptol and input matrix type */
  if ( (sparsetype != CSR_MAT) && (sparsetype != CSC_MAT) )
    return NULL;
  if ( droptol < ZERO )
    return NULL;
  if (SUNMatGetID(Ad) != SUNMATRIX_DENSE)
    return NULL;
  
  /* set size of new matrix */
  M = SM_ROWS_D(Ad);
  N = SM_COLUMNS_D(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j=0; j<N; j++)
    for (i=0; i<M; i++)
      nnz += (SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol);
    
  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype);
  if (As == NULL)  return NULL;
  
  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT) {
    for (j=0; j<N; j++) {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i=0; i<M; i++) {
        if ( SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_D(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  } else {       /* CSR_MAT */
    for (i=0; i<M; i++) {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j=0; j<N; j++) {
        if ( SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_D(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }
    
  return(As);
}